

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_2.cpp
# Opt level: O2

void increment_day(Date *d)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  uVar1 = d->m;
  if (uVar1 < 0xd) {
    if ((0x15aaU >> (uVar1 & 0x1f) & 1) != 0) {
      iVar3 = d->d + 1;
      bVar4 = d->d == 0x1f;
      goto LAB_00102508;
    }
    if (uVar1 == 2) {
      bVar4 = is_leap(d);
      iVar2 = d->d;
      iVar3 = iVar2 + 1;
      if (bVar4) {
        bVar4 = iVar2 == 0x1d;
      }
      else {
        bVar4 = iVar2 == 0x1c;
      }
      goto LAB_00102508;
    }
  }
  iVar3 = d->d + 1;
  bVar4 = d->d == 0x1e;
LAB_00102508:
  if (bVar4) {
    iVar3 = 1;
  }
  d->d = iVar3;
  if (iVar3 == 1) {
    iVar3 = uVar1 + 1;
    if (uVar1 == 0xc) {
      iVar3 = 1;
    }
    d->m = iVar3;
    if (iVar3 == 1) {
      d->y = d->y + 1;
    }
  }
  return;
}

Assistant:

void increment_day(Date& d)
{
	switch (d.m)
	{
	case 2:
	{
		if (is_leap(d))
			d.d = next_val(29, d.d);
		else
			d.d = next_val(28, d.d);
		break;
	}
	case 1:
	case 3:
	case 5:
	case 7:
	case 8:
	case 10:
	case 12:
		d.d = next_val(31, d.d);
		break;
	default:
		d.d = next_val(30, d.d);
	}

	// handles case when next day is the first day of next month
	if (d.d == 1)
	{
		d.m = next_val(12, d.m);
		if (d.m == 1)
			++d.y;
	}
}